

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreakOperator.cpp
# Opt level: O2

LBDOperator * lts2::CreateFreakOperator(int M)

{
  LBDOperator *this;
  
  this = (LBDOperator *)operator_new(0x98);
  FreakOperator::FreakOperator((FreakOperator *)this,M);
  return this;
}

Assistant:

lts2::LBDOperator *lts2::CreateFreakOperator(int M)
{
  lts2::FreakOperator *out = new lts2::FreakOperator(M);
  if (!out)
  {
    std::cerr << __FUNCTION__ << "\t" << "Something when wrong :-(";
  }
  return out;
}